

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O3

void hexdumpqwords<unsigned_char*>(string *str,uchar *buf,size_t nLength)

{
  pointer pcVar1;
  size_t sVar2;
  
  std::__cxx11::string::resize((ulong)str,(char)str->_M_string_length + (char)nLength * '\x11');
  if (nLength != 0) {
    pcVar1 = (str->_M_dataplus)._M_p + str->_M_string_length + nLength * -0x11;
    sVar2 = 0;
    do {
      *pcVar1 = ' ';
      qword2hexchars(*(uint64_t *)(buf + sVar2 * 8),pcVar1 + 1);
      sVar2 = sVar2 + 1;
      pcVar1 = pcVar1 + 0x11;
    } while (nLength != sVar2);
  }
  return;
}

Assistant:

void hexdumpqwords(std::string &str, I buf, size_t nLength)
{
    str.resize(str.size()+nLength*17);
    char *p= &str[str.size()-nLength*17];
    while(nLength--)
    {
        *p++ = ' ';
        qword2hexchars(get64le(buf), p); p+=16; buf+=8;
    }
}